

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_column_reader.hpp
# Opt level: O0

bool duckdb::BooleanParquetValueConversion::PlainRead<false>
               (ByteBuffer *plain_data,ColumnReader *reader)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  BooleanColumnReader *pBVar4;
  uint8_t *puVar5;
  ByteBuffer *in_RDI;
  bool ret;
  uint8_t *byte_pos;
  
  pBVar4 = ColumnReader::Cast<duckdb::BooleanColumnReader>((ColumnReader *)plain_data);
  puVar5 = &pBVar4->byte_pos;
  bVar1 = *in_RDI->ptr;
  bVar2 = *puVar5;
  uVar3 = *puVar5;
  *puVar5 = uVar3 + '\x01';
  if ((uint8_t)(uVar3 + '\x01') == '\b') {
    *puVar5 = '\0';
    ByteBuffer::unsafe_inc(in_RDI,1);
  }
  return ((int)(uint)bVar1 >> (bVar2 & 0x1f) & 1U) != 0;
}

Assistant:

static bool PlainRead(ByteBuffer &plain_data, ColumnReader &reader) {
		auto &byte_pos = reader.Cast<BooleanColumnReader>().byte_pos;
		bool ret = (*plain_data.ptr >> byte_pos) & 1;
		if (++byte_pos == 8) {
			byte_pos = 0;
			if (CHECKED) {
				plain_data.inc(1);
			} else {
				plain_data.unsafe_inc(1);
			}
		}
		return ret;
	}